

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser-test.c++
# Opt level: O2

void __thiscall capnp::anon_unknown_0::FakeFileReader::FakeFileReader(FakeFileReader *this)

{
  Clock *clock;
  StringPtr pathText;
  Array<kj::String> local_38;
  
  (this->super_Filesystem)._vptr_Filesystem = (_func_int **)&PTR_getRoot_0065b6c8;
  clock = kj::nullClock();
  kj::newInMemoryDirectory((kj *)&local_38,clock);
  (this->root).disposer = (Disposer *)local_38.ptr;
  (this->root).ptr = (Directory *)local_38.size_;
  local_38.size_ = 0;
  kj::Own<kj::Directory>::dispose((Own<kj::Directory> *)&local_38);
  kj::Path::Path((Path *)&local_38,(ArrayPtr<const_kj::StringPtr>)ZEXT816(0));
  pathText.content.size_ = 0x15;
  pathText.content.ptr = "/path/to/current/dir";
  kj::Path::eval(&this->cwd,(Path *)&local_38,pathText);
  kj::Array<kj::String>::~Array(&local_38);
  kj::Directory::openSubdir
            ((Directory *)&this->current,(PathPtr)*(ArrayPtr<const_kj::String> *)&(this->root).ptr,
             (WriteMode)(this->cwd).parts.size_);
  return;
}

Assistant:

void add(kj::StringPtr name, kj::StringPtr content) {
    root->openFile(cwd.evalNative(name), kj::WriteMode::CREATE | kj::WriteMode::CREATE_PARENT)
        ->writeAll(content);
  }